

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

int __thiscall ON_BinaryArchive::Read3dmLayer(ON_BinaryArchive *this,ON_Layer **ppLayer)

{
  ON_Layer *pOVar1;
  ON_Object *pOVar2;
  bool bVar3;
  int iVar4;
  ON_Layer *layer;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON_Layer *local_38;
  uint local_2c;
  ON_Object *local_28;
  ON__INT64 local_20;
  
  bVar3 = Read3dmTableRecord(this,layer_table,ppLayer);
  if (!bVar3) {
    return 0;
  }
  local_38 = (ON_Layer *)0x0;
  if (this->m_3dm_version == 1) {
    bVar3 = Read3dmV1Layer(this,&local_38);
    if (local_38 != (ON_Layer *)0x0 && bVar3) {
      Internal_Read3dmUpdateManifest(this,&local_38->super_ON_ModelComponent);
    }
    goto LAB_003a4676;
  }
  local_2c = 0;
  local_20 = 0;
  bVar3 = BeginRead3dmBigChunk(this,&local_2c,&local_20);
  if (!bVar3) goto LAB_003a4676;
  if (local_2c != 0xffffffff) {
    if (local_2c == 0x20008050) {
      Internal_Increment3dmTableItemCount(this);
      local_28 = (ON_Object *)0x0;
      iVar4 = ReadObjectHelper(this,&local_28);
      pOVar2 = local_28;
      if (iVar4 != 0) {
        local_38 = ON_Layer::Cast(local_28);
        if (local_38 == (ON_Layer *)0x0) {
          if (pOVar2 != (ON_Object *)0x0) {
            (*pOVar2->_vptr_ON_Object[4])(pOVar2);
          }
        }
        else {
          Internal_Read3dmUpdateManifest(this,&local_38->super_ON_ModelComponent);
        }
      }
      if (local_38 != (ON_Layer *)0x0) goto LAB_003a466c;
      iVar4 = 0x2864;
    }
    else {
      iVar4 = 0x2868;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,iVar4,"","ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
  }
LAB_003a466c:
  EndRead3dmChunk(this,false);
LAB_003a4676:
  pOVar1 = local_38;
  if (local_38 != (ON_Layer *)0x0) {
    ON_Layer::HasPerViewportSettings(local_38,&ON_nil_uuid);
  }
  *ppLayer = pOVar1;
  return (uint)(pOVar1 != (ON_Layer *)0x0);
}

Assistant:

int ON_BinaryArchive::Read3dmLayer( ON_Layer** ppLayer )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::layer_table, (void**)ppLayer))
    return 0;

  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON_Layer* layer = nullptr;
  // returns 0 at end of layer table
  if ( m_3dm_version == 1 )
  {
    if (Read3dmV1Layer(layer) && nullptr != layer)
      Internal_Read3dmUpdateManifest(*layer);
  }
  else 
  {
    // version 2+
    tcode = 0;
    big_value = 0;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_LAYER_RECORD )
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) )
        {
          layer = ON_Layer::Cast(p);
          if ( nullptr == layer )
            delete p;
          else
          {
            Internal_Read3dmUpdateManifest(*layer);
          }
        }
        if (nullptr == layer) {
          ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
        }
      }
      else if ( tcode != TCODE_ENDOFTABLE ) {
        ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
      }
      EndRead3dmChunk();
    }
  }
  if ( layer )
    layer->HasPerViewportSettings(ON_nil_uuid); // this call sets ON_Layer::m__runtime_flags
  *ppLayer = layer;
  return (layer) ? 1 : 0;
}